

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorLuminancePicker::setVal(QColorLuminancePicker *this,int v)

{
  int *piVar1;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  QColorLuminancePicker *in_stack_ffffffffffffffc8;
  long *plVar2;
  int _t3;
  int local_14 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDI + 0x28) != in_ESI) {
    local_14[1] = 0;
    local_14[0] = 0xff;
    piVar1 = qMin<int>(local_14 + 2,local_14);
    piVar1 = qMax<int>(local_14 + 1,piVar1);
    *(int *)(in_RDI + 0x28) = *piVar1;
    plVar2 = *(long **)(in_RDI + 0x38);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    _t3 = (int)((ulong)plVar2 >> 0x20);
    *(undefined8 *)(in_RDI + 0x38) = 0;
    QWidget::repaint(&in_stack_ffffffffffffffc8->super_QWidget);
    newHsv(in_stack_ffffffffffffffc8,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,_t3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorLuminancePicker::setVal(int v)
{
    if (val == v)
        return;
    val = qMax(0, qMin(v,255));
    delete pix; pix=nullptr;
    repaint();
    emit newHsv(hue, sat, val);
}